

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wthelper.h
# Opt level: O2

void __thiscall
WriterTestHelper<unsigned_char,_3U,_32849U>::texinfo::resize
          (texinfo *this,GLuint levels,GLuint layers,GLuint faces,GLuint dimensions,bool array,
          GLsizei width,GLsizei height,GLsizei depth)

{
  ktx_uint32_t kVar1;
  undefined3 in_register_00000089;
  
  (this->super_wthTexInfo).super_ktxTextureCreateInfo.numLayers = layers;
  (this->super_wthTexInfo).super_ktxTextureCreateInfo.numFaces = faces;
  (this->super_wthTexInfo).super_ktxTextureCreateInfo.numLevels = levels;
  (this->super_wthTexInfo).super_ktxTextureCreateInfo.numDimensions = dimensions;
  (this->super_wthTexInfo).super_ktxTextureCreateInfo.generateMipmaps = false;
  (this->super_wthTexInfo).super_ktxTextureCreateInfo.isArray = array;
  (this->super_wthTexInfo).super_ktxTextureCreateInfo.baseWidth = width;
  (this->super_wthTexInfo).super_ktxTextureCreateInfo.baseHeight = height;
  (this->super_wthTexInfo).super_ktxTextureCreateInfo.baseDepth = depth;
  if (CONCAT31(in_register_00000089,array) == 0) {
    layers = 0;
  }
  (this->super_wthTexInfo).headerNumLayers = layers;
  if (dimensions < 2) {
    height = 0;
  }
  (this->super_wthTexInfo).headerPixelHeight = height;
  kVar1 = 0;
  if (dimensions == 3) {
    kVar1 = depth;
  }
  (this->super_wthTexInfo).headerPixelDepth = kVar1;
  return;
}

Assistant:

void resize(GLuint levels, GLuint layers, GLuint faces,
                    GLuint dimensions, bool array,
                    GLsizei width, GLsizei height, GLsizei depth) {
            this->numLayers = layers;
            this->numFaces = faces;
            this->numLevels = levels;
            this->numDimensions = dimensions;
            this->generateMipmaps = false;
            this->isArray = array;
            baseWidth = width;
            baseHeight = height;
            baseDepth = depth;
            headerNumLayers = isArray ? numLayers: 0;
            headerPixelHeight = numDimensions >= 2 ? height : 0;
            headerPixelDepth = numDimensions == 3 ? depth : 0;
       }